

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rw_socket.cpp
# Opt level: O0

void __thiscall cppnet::RWSocket::OnTimer(RWSocket *this)

{
  bool bVar1;
  int iVar2;
  unordered_map<unsigned_long,_std::shared_ptr<cppnet::Socket>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<cppnet::Socket>_>_>_>
  *this_00;
  undefined4 extraout_var;
  element_type *this_01;
  enable_shared_from_this<cppnet::RWSocket> local_38;
  uint local_24;
  undefined1 local_20 [8];
  shared_ptr<cppnet::CppNetBase> cppnet_base;
  RWSocket *this_local;
  
  cppnet_base.super___shared_ptr<cppnet::CppNetBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  bVar1 = std::atomic::operator_cast_to_bool((atomic *)&this->_connecting);
  if (bVar1) {
    this_00 = (unordered_map<unsigned_long,_std::shared_ptr<cppnet::Socket>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<cppnet::Socket>_>_>_>
               *)__connecting_socket_map();
    std::
    unordered_map<unsigned_long,_std::shared_ptr<cppnet::Socket>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<cppnet::Socket>_>_>_>
    ::erase(this_00,&(this->super_Socket)._sock);
    iVar2 = (*(this->super_Socket)._vptr_Socket[2])();
    bVar1 = CheckConnect(CONCAT44(extraout_var,iVar2));
    if (bVar1) {
      (*(this->super_Socket)._vptr_Socket[0x10])(this,0);
    }
    else {
      (*(this->super_Socket)._vptr_Socket[0x10])(this,3);
    }
  }
  else {
    std::weak_ptr<cppnet::CppNetBase>::lock((weak_ptr<cppnet::CppNetBase> *)local_20);
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_20);
    if (bVar1) {
      this_01 = std::
                __shared_ptr_access<cppnet::CppNetBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<cppnet::CppNetBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_20);
      std::enable_shared_from_this<cppnet::RWSocket>::shared_from_this(&local_38);
      CppNetBase::OnTimer(this_01,(shared_ptr<cppnet::RWSocket> *)&local_38);
      std::shared_ptr<cppnet::RWSocket>::~shared_ptr((shared_ptr<cppnet::RWSocket> *)&local_38);
    }
    local_24 = (uint)!bVar1;
    std::shared_ptr<cppnet::CppNetBase>::~shared_ptr((shared_ptr<cppnet::CppNetBase> *)local_20);
  }
  return;
}

Assistant:

void RWSocket::OnTimer() {
    if (_connecting) {
        __connecting_socket_map.erase(_sock);
        if (CheckConnect(GetSocket())) {
            OnConnect(CEC_SUCCESS);
        } else {
            OnConnect(CEC_CONNECT_REFUSE);
        }
        return;
    }
    auto cppnet_base = _cppnet_base.lock();
    if (!cppnet_base) {
        return;
    }
    cppnet_base->OnTimer(shared_from_this());
}